

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qps.h
# Opt level: O0

void __thiscall qps::qps(qps *this)

{
  thread *in_RDI;
  thread *unaff_retaddr;
  thread *__t;
  thread *__f;
  
  *(undefined1 *)&(in_RDI->_M_id)._M_thread = 0;
  __t = in_RDI + 1;
  __f = in_RDI;
  std::thread::thread((thread *)0x1c0253);
  std::atomic<unsigned_int>::atomic
            ((atomic<unsigned_int> *)in_RDI,(__integral_type)((ulong)__t >> 0x20));
  std::thread::thread<qps::qps()::_lambda()_1_,,void>(unaff_retaddr,(type *)__f);
  std::thread::operator=(in_RDI,__t);
  std::thread::~thread((thread *)0x1c029b);
  return;
}

Assistant:

qps() : counter_(0) {
    thd_ = std::thread([this] {
      while (!stop_) {
        std::cout << "qps: " << counter_.load(std::memory_order_acquire)
                  << '\n';
        std::this_thread::sleep_for(std::chrono::seconds(1));
        // counter_.store(0, std::memory_order_release);
      }
    });
  }